

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall
libcellml::Analyser::AnalyserImpl::analyseComponent(AnalyserImpl *this,ComponentPtr *component)

{
  IssueImpl *this_00;
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  element_type *peVar5;
  element_type *this_01;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  element_type *peVar12;
  element_type *peVar13;
  size_t sVar14;
  byte local_239;
  ComponentEntity local_1f0;
  ulong local_1e0;
  size_t i_1;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [8];
  AnalyserInternalVariablePtr internalVariable;
  VariablePtr variable;
  size_t i;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  IssuePtr issue;
  undefined1 local_d8 [8];
  AnalyserInternalEquationPtr internalEquation;
  undefined1 local_b8 [8];
  XmlNodePtr node;
  shared_ptr<libcellml::XmlDoc> *doc;
  __normal_iterator<std::shared_ptr<libcellml::XmlDoc>_*,_std::vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>_>
  local_98;
  iterator __end2;
  iterator __begin2;
  string local_78;
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  local_58;
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  *local_40;
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  *__range2;
  __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  ComponentPtr *component_local;
  AnalyserImpl *this_local;
  
  local_18 = (__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             component;
  component_local = (ComponentPtr *)this;
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
  Component::math_abi_cxx11_((string *)&__range2,peVar5);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&__range2);
  if (((bVar2 ^ 0xff) & 1) != 0) {
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_18);
    Component::math_abi_cxx11_(&local_78,peVar5);
    multiRootXml(&local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    local_40 = &local_58;
    __end2 = std::
             vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
             ::begin(local_40);
    local_98._M_current =
         (shared_ptr<libcellml::XmlDoc> *)
         std::
         vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
         ::end(local_40);
    while (bVar3 = __gnu_cxx::operator!=(&__end2,&local_98), bVar3) {
      node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<libcellml::XmlDoc>_*,_std::vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>_>
           ::operator*(&__end2);
      std::__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )node.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi);
      XmlDoc::rootNode((XmlDoc *)
                       &internalEquation.
                        super___shared_ptr<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
      std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&internalEquation.
                     super___shared_ptr<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
      XmlNode::firstChild((XmlNode *)local_b8);
      std::shared_ptr<libcellml::XmlNode>::~shared_ptr
                ((shared_ptr<libcellml::XmlNode> *)
                 &internalEquation.
                  super___shared_ptr<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      while (bVar3 = std::operator!=((shared_ptr<libcellml::XmlNode> *)local_b8,(nullptr_t)0x0),
            bVar3) {
        this_01 = std::
                  __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_b8);
        bVar3 = XmlNode::isMathmlElement(this_01,(char *)0x0);
        if (bVar3) {
          AnalyserInternalEquation::create
                    ((AnalyserInternalEquation *)local_d8,(ComponentPtr *)local_18);
          std::
          vector<std::shared_ptr<libcellml::AnalyserInternalEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalEquation>_>_>
          ::push_back(&this->mInternalEquations,(value_type *)local_d8);
          peVar6 = std::
                   __shared_ptr_access<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_d8);
          peVar7 = std::
                   __shared_ptr_access<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_d8);
          std::
          __shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&peVar7->mAst);
          AnalyserEquationAst::parent
                    ((AnalyserEquationAst *)
                     &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          analyseNode(this,(XmlNodePtr *)local_b8,&peVar6->mAst,
                      (AnalyserEquationAstPtr *)
                      &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(ComponentPtr *)local_18,(AnalyserInternalEquationPtr *)local_d8)
          ;
          std::shared_ptr<libcellml::AnalyserEquationAst>::~shared_ptr
                    ((shared_ptr<libcellml::AnalyserEquationAst> *)
                     &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          peVar6 = std::
                   __shared_ptr_access<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_d8);
          peVar8 = std::
                   __shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar6->mAst);
          if (peVar8->mPimpl->mType != EQUALITY) {
            Issue::IssueImpl::create();
            peVar9 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_f8);
            this_00 = peVar9->mPimpl;
            peVar6 = std::
                     __shared_ptr_access<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::AnalyserInternalEquation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_d8);
            expression_abi_cxx11_(&local_158,this,&peVar6->mAst,true);
            std::operator+(&local_138,"Equation ",&local_158);
            std::operator+(&local_118,&local_138," is not an equality statement (i.e. LHS = RHS).");
            Issue::IssueImpl::setDescription(this_00,&local_118);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&local_158);
            peVar9 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_f8);
            Issue::IssueImpl::setReferenceRule
                      (peVar9->mPimpl,ANALYSER_EQUATION_NOT_EQUALITY_STATEMENT);
            peVar9 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_f8);
            peVar10 = std::
                      __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&peVar9->mPimpl->mItem);
            AnyCellmlElement::AnyCellmlElementImpl::setComponent
                      (peVar10->mPimpl,(ComponentPtr *)local_18,COMPONENT);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_f8);
            std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_f8)
            ;
          }
          std::shared_ptr<libcellml::AnalyserInternalEquation>::~shared_ptr
                    ((shared_ptr<libcellml::AnalyserInternalEquation> *)local_d8);
        }
        std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_b8);
        XmlNode::next((XmlNode *)&i);
        std::shared_ptr<libcellml::XmlNode>::operator=
                  ((shared_ptr<libcellml::XmlNode> *)local_b8,(shared_ptr<libcellml::XmlNode> *)&i);
        std::shared_ptr<libcellml::XmlNode>::~shared_ptr((shared_ptr<libcellml::XmlNode> *)&i);
      }
      std::shared_ptr<libcellml::XmlNode>::~shared_ptr((shared_ptr<libcellml::XmlNode> *)local_b8);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libcellml::XmlDoc>_*,_std::vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
    ::~vector(&local_58);
  }
  variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_18);
    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Component::variableCount(peVar5);
    if (p_Var11 <=
        variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi) break;
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_18);
    Component::variable((Component *)
                        &internalVariable.
                         super___shared_ptr<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,(size_t)peVar5);
    AnalyserImpl::internalVariable((AnalyserImpl *)local_190,(VariablePtr *)this);
    peVar12 = std::
              __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&internalVariable.
                             super___shared_ptr<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
    i_1._7_1_ = 0;
    Variable::initialValue_abi_cxx11_(&local_1b0,peVar12);
    uVar4 = std::__cxx11::string::empty();
    local_239 = 0;
    if ((uVar4 & 1) == 0) {
      peVar13 = std::
                __shared_ptr_access<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_190);
      peVar12 = std::
                __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&peVar13->mVariable);
      Variable::initialValue_abi_cxx11_(&local_1d0,peVar12);
      i_1._7_1_ = 1;
      local_239 = std::__cxx11::string::empty();
    }
    if ((i_1._7_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    std::__cxx11::string::~string((string *)&local_1b0);
    if ((local_239 & 1) != 0) {
      peVar13 = std::
                __shared_ptr_access<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_190);
      AnalyserInternalVariable::setVariable
                (peVar13,(VariablePtr *)
                         &internalVariable.
                          super___shared_ptr<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,true);
    }
    std::shared_ptr<libcellml::AnalyserInternalVariable>::~shared_ptr
              ((shared_ptr<libcellml::AnalyserInternalVariable> *)local_190);
    std::shared_ptr<libcellml::Variable>::~shared_ptr
              ((shared_ptr<libcellml::Variable> *)
               &internalVariable.
                super___shared_ptr<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
  }
  local_1e0 = 0;
  while( true ) {
    uVar1 = local_1e0;
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_18);
    sVar14 = ComponentEntity::componentCount(&peVar5->super_ComponentEntity);
    if (sVar14 <= uVar1) break;
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_18);
    ComponentEntity::component(&local_1f0,(size_t)peVar5);
    analyseComponent(this,(ComponentPtr *)&local_1f0);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)&local_1f0);
    local_1e0 = local_1e0 + 1;
  }
  return;
}

Assistant:

void Analyser::AnalyserImpl::analyseComponent(const ComponentPtr &component)
{
    // Retrieve the math string associated with the given component and analyse
    // it, one equation at a time, keeping in mind that it may consist of
    // several <math> elements, hence our use of multiRootXml().

    if (!component->math().empty()) {
        for (const auto &doc : multiRootXml(component->math())) {
            for (auto node = doc->rootNode()->firstChild(); node != nullptr; node = node->next()) {
                if (node->isMathmlElement()) {
                    // Create and keep track of the equation associated with the
                    // given node.

                    auto internalEquation = AnalyserInternalEquation::create(component);

                    mInternalEquations.push_back(internalEquation);

                    // Actually analyse the node.
                    // Note: we must not test internalEquation->mAst->parent()
                    //       since if it is equal to nullptr then a parent will
                    //       be created by analyseNode().

                    analyseNode(node, internalEquation->mAst, internalEquation->mAst->parent(), component, internalEquation);

                    // Make sure that our internal equation is an equality
                    // statement.

                    if (internalEquation->mAst->mPimpl->mType != AnalyserEquationAst::Type::EQUALITY) {
                        auto issue = Issue::IssueImpl::create();

                        issue->mPimpl->setDescription("Equation " + expression(internalEquation->mAst)
                                                      + " is not an equality statement (i.e. LHS = RHS).");
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ANALYSER_EQUATION_NOT_EQUALITY_STATEMENT);
                        issue->mPimpl->mItem->mPimpl->setComponent(component);

                        addIssue(issue);
                    }
                }
            }
        }
    }

    // Go through the given component's variables and internally keep track of
    // the ones that have an initial value.

    for (size_t i = 0; i < component->variableCount(); ++i) {
        // If `variable` has an initial value and the variable held by
        // `internalVariable` doesn't, then replace the variable held by
        // `internalVariable`.

        auto variable = component->variable(i);
        auto internalVariable = Analyser::AnalyserImpl::internalVariable(variable);

        if (!variable->initialValue().empty()
            && internalVariable->mVariable->initialValue().empty()) {
            internalVariable->setVariable(variable);
        }
    }

    // Do the same for the components encapsulated by the given component.

    for (size_t i = 0; i < component->componentCount(); ++i) {
        analyseComponent(component->component(i));
    }
}